

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

float core::image::desaturate_lightness<float>(float *v)

{
  float *pfVar1;
  float *pfVar2;
  
  pfVar1 = std::__max_element<float_const*,__gnu_cxx::__ops::_Iter_less_iter>(v,v + 3);
  pfVar2 = std::__min_element<float_const*,__gnu_cxx::__ops::_Iter_less_iter>(v,v + 3);
  return *pfVar1 * 0.5 + *pfVar2 * 0.5;
}

Assistant:

inline T
desaturate_lightness (T const* v)
{
    T const* max = std::max_element(v, v + 3);
    T const* min = std::min_element(v, v + 3);
    return math::interpolate(*max, *min, 0.5f, 0.5f);
}